

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

void __thiscall Escape::CGraph::writeBinaryFile(CGraph *this,char *path)

{
  char cVar1;
  ostream *poVar2;
  ofstream out_file;
  int aiStack_1f0 [120];
  
  std::ofstream::ofstream(&out_file,path,_S_out|_S_bin);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    printf("Could not write to the file %s",path);
  }
  else {
    std::ostream::write((char *)&out_file,(long)this);
    std::ostream::write((char *)&out_file,(long)&this->nEdges);
    std::ostream::write((char *)&out_file,(long)this->offsets);
    std::ostream::write((char *)&out_file,(long)this->nbors);
    std::ofstream::close();
    if (*(int *)((long)aiStack_1f0 + *(long *)(_out_file + -0x18)) != 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Error occurred at writing time!");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
  }
  std::ofstream::~ofstream(&out_file);
  return;
}

Assistant:

void CGraph::writeBinaryFile(const char *path) {
    auto out_file = std::ofstream(path, std::ios::out | std::ios::binary);
    if ( !out_file.is_open() ) {
        printf("Could not write to the file %s",path);
        return;
    }
    out_file.write(reinterpret_cast<const char*>(&nVertices), sizeof(nVertices));
    out_file.write(reinterpret_cast<const char*>(&nEdges), sizeof(nEdges));
    out_file.write(reinterpret_cast<const char*>(offsets), std::streamsize((nVertices+1)* sizeof(VertexIdx)));
    out_file.write(reinterpret_cast<const char*>(nbors), nEdges*sizeof(EdgeIdx));
    out_file.close();
    if(!out_file.good()) {
        std::cout << "Error occurred at writing time!" << std::endl;
    }
}